

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# customer.cpp
# Opt level: O0

void __thiscall User::User(User *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  list<Ticket,_std::allocator<Ticket>_> local_28;
  User *local_10;
  User *this_local;
  
  local_10 = this;
  std::__cxx11::list<Ticket,_std::allocator<Ticket>_>::list(&this->tickets);
  std::__cxx11::string::string((string *)&this->first_name);
  std::__cxx11::string::string((string *)&this->second_name);
  std::__cxx11::string::string((string *)&this->passport_id);
  memset(&local_28,0,0x18);
  std::__cxx11::list<Ticket,_std::allocator<Ticket>_>::list(&local_28);
  std::__cxx11::list<Ticket,_std::allocator<Ticket>_>::operator=(&this->tickets,&local_28);
  std::__cxx11::list<Ticket,_std::allocator<Ticket>_>::~list(&local_28);
  std::__cxx11::string::string((string *)&local_48);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->first_name,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_68);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->second_name,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  this->age = 0;
  return;
}

Assistant:

User::User()
{
    tickets = std::list<Ticket>();
    first_name = std::string();
    second_name = std::string();
    string passport_id();
    age = int();
}